

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O1

int64_t __thiscall
aeron::archive::AeronArchive::callAndPollForResponse
          (AeronArchive *this,function<bool_(long)> *f,char *request)

{
  pointer correlationId;
  index_t index;
  element_type *peVar1;
  AtomicBuffer *this_00;
  bool bVar2;
  int64_t iVar3;
  SourcedException *this_01;
  long *plVar4;
  char *pcVar5;
  size_type *psVar6;
  unique_lock<std::mutex> lock;
  allocator local_ba;
  allocator local_b9;
  string local_b8;
  unique_lock<std::mutex> local_98;
  string local_88;
  string local_68;
  string local_48 [32];
  
  local_98._M_device = &this->lock_;
  local_98._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_98);
  local_98._M_owns = true;
  peVar1 = (this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (peVar1->m_toDriverRingBuffer).m_buffer;
  index = (peVar1->m_toDriverRingBuffer).m_correlationIdCounterIndex;
  concurrent::AtomicBuffer::boundsCheck(this_00,index,8);
  LOCK();
  plVar4 = (long *)(this_00->m_buffer + index);
  correlationId = (pointer)*plVar4;
  *plVar4 = *plVar4 + 1;
  UNLOCK();
  local_b8._M_dataplus._M_p = correlationId;
  if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  bVar2 = (*f->_M_invoker)((_Any_data *)f,(long *)&local_b8);
  if (bVar2) {
    iVar3 = pollForResponse(this,(int64_t)correlationId);
    std::unique_lock<std::mutex>::~unique_lock(&local_98);
    return iVar3;
  }
  this_01 = (SourcedException *)__cxa_allocate_exception(0x48);
  std::__cxx11::string::string(local_48,request,&local_b9);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_48);
  local_b8._M_dataplus._M_p = (pointer)*plVar4;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_b8._M_dataplus._M_p == psVar6) {
    local_b8.field_2._M_allocated_capacity = *psVar6;
    local_b8.field_2._8_4_ = (undefined4)plVar4[3];
    local_b8.field_2._12_4_ = *(undefined4 *)((long)plVar4 + 0x1c);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  }
  else {
    local_b8.field_2._M_allocated_capacity = *psVar6;
  }
  local_b8._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,
             "std::int64_t aeron::archive::AeronArchive::callAndPollForResponse(std::function<bool (std::int64_t)> &&, const char *)"
             ,"");
  pcVar5 = aeron::util::past_prefix
                     ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                     );
  std::__cxx11::string::string((string *)&local_68,pcVar5,&local_ba);
  aeron::util::SourcedException::SourcedException(this_01,&local_b8,&local_88,&local_68,0x1c1);
  *(undefined ***)this_01 = &PTR__SourcedException_00164280;
  __cxa_throw(this_01,&ArchiveException::typeinfo,aeron::util::SourcedException::~SourcedException);
}

Assistant:

std::int64_t AeronArchive::callAndPollForResponse(std::function<bool(std::int64_t)>&& f, const char* request) {
    std::unique_lock<std::mutex> lock(lock_);

    std::int64_t correlationId = aeron_->nextCorrelationId();

    if (!f(correlationId)) {
        throw ArchiveException(std::string(request) + ": failed to send", SOURCEINFO);
    }

    return pollForResponse(correlationId);
}